

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall DLevelScript::PutLast(DLevelScript *this)

{
  DACSThinker *pDVar1;
  DACSThinker *controller;
  DLevelScript *this_local;
  
  pDVar1 = ::TObjPtr::operator_cast_to_DACSThinker_((TObjPtr *)&DACSThinker::ActiveThinker);
  if (pDVar1->LastScript != this) {
    Unlink(this);
    if (pDVar1->Scripts == (DLevelScript *)0x0) {
      Link(this);
    }
    else {
      if (pDVar1->LastScript != (DLevelScript *)0x0) {
        pDVar1->LastScript->next = this;
      }
      this->prev = pDVar1->LastScript;
      this->next = (DLevelScript *)0x0;
      pDVar1->LastScript = this;
    }
  }
  return;
}

Assistant:

void DLevelScript::PutLast ()
{
	DACSThinker *controller = DACSThinker::ActiveThinker;

	if (controller->LastScript == this)
		return;

	Unlink ();
	if (controller->Scripts == NULL)
	{
		Link ();
	}
	else
	{
		if (controller->LastScript)
			controller->LastScript->next = this;
		prev = controller->LastScript;
		next = NULL;
		controller->LastScript = this;
	}
}